

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *field)

{
  StartModuleField *pSVar1;
  long lVar2;
  ModuleFieldList *pMVar3;
  Var *local_18;
  
  local_18 = (Var *)((field->_M_t).
                     super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
                     .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl + 0x40);
  std::vector<wabt::Var*,std::allocator<wabt::Var*>>::emplace_back<wabt::Var*>
            ((vector<wabt::Var*,std::allocator<wabt::Var*>> *)&this->starts,&local_18);
  pSVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
           .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>.
  super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl = (StartModuleField *)0x0;
  if ((*(long *)(pSVar1 + 0x10) == 0) && (*(long *)(pSVar1 + 8) == 0)) {
    lVar2 = *(long *)&this->field_0x48;
    if (lVar2 == 0) {
      pMVar3 = &this->fields;
    }
    else {
      *(long *)(pSVar1 + 0x10) = lVar2;
      pMVar3 = (ModuleFieldList *)(lVar2 + 8);
    }
    *(StartModuleField **)pMVar3 = pSVar1;
    *(StartModuleField **)&this->field_0x48 = pSVar1;
    *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<StartModuleField> field) {
  starts.push_back(&field->start);
  fields.push_back(std::move(field));
}